

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_toggle.c
# Opt level: O3

void toggle_properties(t_gobj *z,_glist *owner)

{
  iemgui_new_dialog(z,(t_iemgui *)z,"tgl",
                    (float)(*(int *)((long)&z[4].g_pd + 4) /
                           *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4)),8.0,0.0,0.0,
                    *(t_float *)((long)&z[0x49].g_pd + 4),0.0,1,-1,"","",1,-1,-1);
  return;
}

Assistant:

static void toggle_properties(t_gobj *z, t_glist *owner)
{
    t_toggle *x = (t_toggle *)z;
    iemgui_new_dialog(x, &x->x_gui, "tgl",
                      x->x_gui.x_w/IEMGUI_ZOOM(x), IEM_GUI_MINSIZE,
                      0, 0,
                      x->x_nonzero, 0,
                      1,
                      -1, "", "",
                      1, -1, -1);
}